

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall smf::Options::setModified(Options *this,string *optionName,string *aString)

{
  Option_register *pOVar1;
  int iVar2;
  
  iVar2 = getRegIndex(this,optionName);
  if (-1 < iVar2) {
    iVar2 = getRegIndex(this,optionName);
    pOVar1 = (this->m_optionRegister).
             super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2];
    std::__cxx11::string::_M_assign((string *)&pOVar1->m_modifiedOption);
    pOVar1->m_modifiedQ = true;
  }
  return;
}

Assistant:

void Options::setModified(const std::string& optionName,
		const std::string& aString) {
	int index = getRegIndex(optionName);
	if (index < 0) {
		return;
	}

	m_optionRegister[getRegIndex(optionName)]->setModified(aString);
}